

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O3

bool cfd::core::Serializer::IsBigEndian(void)

{
  if (IsBigEndian()::is_big_endian == (undefined1 *)0x0) {
    IsBigEndian()::is_big_endian = &IsBigEndian()::kFalse;
  }
  return (bool)IsBigEndian()::kFalse;
}

Assistant:

static bool IsBigEndian() {
  static const uint32_t k32bitValue = 0x04030201;
  static bool* is_big_endian = nullptr;
  static bool kTrue = true;
  static bool kFalse = false;
  if (is_big_endian == nullptr) {
    uint8_t buf[4];
    memcpy(buf, &k32bitValue, sizeof(buf));
    if (buf[0] == 1) {
      // little
      is_big_endian = &kFalse;
    } else {
      is_big_endian = &kTrue;
    }
  }
  return *is_big_endian;
}